

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O2

bool __thiscall
double_conversion::DoubleToStringConverter::ToPrecision
          (DoubleToStringConverter *this,double value,int precision,StringBuilder *result_builder)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  bool sign;
  int decimal_rep_length;
  int decimal_point;
  double local_b0;
  char decimal_rep [121];
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    bVar1 = HandleSpecialValues(this,value,result_builder);
    return bVar1;
  }
  if (precision - 0x79U < 0xffffff88) {
    bVar1 = false;
  }
  else {
    local_b0 = value;
    DoubleToAscii(value,PRECISION,precision,decimal_rep,0x79,&sign,&decimal_rep_length,
                  &decimal_point);
    if ((sign == true) && (local_b0 != 0.0 || (this->flags_ & 8U) == 0)) {
      iVar3 = result_builder->position_;
      result_builder->position_ = iVar3 + 1;
      (result_builder->buffer_).start_[iVar3] = '-';
    }
    if ((this->max_leading_padding_zeroes_in_precision_mode_ < 1 - decimal_point) ||
       (this->max_trailing_padding_zeroes_in_precision_mode_ <
        (int)((decimal_point - precision) + (uint)(((uint)this->flags_ >> 2 & 1) != 0)))) {
      for (lVar2 = (long)decimal_rep_length; lVar2 < (long)(ulong)(uint)precision; lVar2 = lVar2 + 1
          ) {
        decimal_rep[lVar2] = '0';
      }
      CreateExponentialRepresentation(this,decimal_rep,precision,decimal_point + -1,result_builder);
    }
    else {
      iVar3 = 0;
      if (0 < precision - decimal_point) {
        iVar3 = precision - decimal_point;
      }
      CreateDecimalRepresentation
                (this,decimal_rep,decimal_rep_length,decimal_point,iVar3,result_builder);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool DoubleToStringConverter::ToPrecision(double value,
                                          int precision,
                                          StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (precision < kMinPrecisionDigits || precision > kMaxPrecisionDigits) {
    return false;
  }

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add one for the terminating null character.
  const int kDecimalRepCapacity = kMaxPrecisionDigits + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, PRECISION, precision,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);
  DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= precision);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  // The exponent if we print the number as x.xxeyyy. That is with the
  // decimal point after the first digit.
  int exponent = decimal_point - 1;

  int extra_zero = ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) ? 1 : 0;
  if ((-decimal_point + 1 > max_leading_padding_zeroes_in_precision_mode_) ||
      (decimal_point - precision + extra_zero >
       max_trailing_padding_zeroes_in_precision_mode_)) {
    // Fill buffer to contain 'precision' digits.
    // Usually the buffer is already at the correct length, but 'DoubleToAscii'
    // is allowed to return less characters.
    for (int i = decimal_rep_length; i < precision; ++i) {
      decimal_rep[i] = '0';
    }

    CreateExponentialRepresentation(decimal_rep,
                                    precision,
                                    exponent,
                                    result_builder);
  } else {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                                (std::max)(0, precision - decimal_point),
                                result_builder);
  }
  return true;
}